

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<char_const>&,char_const(&)[28],int>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          char (*params_1) [28],int *params_2)

{
  ArrayPtr<const_char> *value;
  char (*value_00) [28];
  int *value_01;
  CappedArray<char,_14UL> local_60;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  char (*local_28) [28];
  int *params_local_2;
  char (*params_local_1) [28];
  ArrayPtr<const_char> *params_local;
  
  local_28 = params_1;
  params_local_2 = (int *)params;
  params_local_1 = (char (*) [28])this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  value = fwd<kj::ArrayPtr<char_const>&>((ArrayPtr<const_char> *)this);
  local_38 = toCharSequence<kj::ArrayPtr<char_const>&>(value);
  value_00 = ::const((char (*) [28])params_local_2);
  local_48 = toCharSequence<char_const(&)[28]>(value_00);
  value_01 = fwd<int>((NoInfer<int> *)local_28);
  toCharSequence<int>(&local_60,value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,(ArrayPtr<const_char> *)&local_60,
             (CappedArray<char,_14UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}